

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

stb_dirtree2 * stb_dirtree2_from_files_relative(char *src,char **filelist,int count)

{
  char **__base;
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  _func_int_void_ptr_void_ptr *__compar;
  stb_dirtree2 *psVar4;
  undefined4 local_938;
  int local_934;
  int local_924;
  int local_91c;
  int local_90c;
  int local_8f8;
  int local_8e4;
  int local_8d4;
  int local_8c4;
  int local_8b4;
  int local_8ac;
  int local_89c;
  int local_894;
  int local_884;
  int local_87c;
  stb_dirtree2 *t_1;
  char *t;
  char *s_1;
  char buffer2 [1024];
  char *s;
  char **files;
  char **descendents;
  stb_dirtree2 *d;
  int local_430;
  int elen;
  int dlen;
  int i;
  char buffer1 [1024];
  int count_local;
  char **filelist_local;
  char *src_local;
  
  buffer1._1020_4_ = count;
  sVar2 = strlen(src);
  local_430 = (int)sVar2;
  files = (char **)0x0;
  s = (char *)0x0;
  if (buffer1._1020_4_ == 0) {
    src_local = (char *)0x0;
  }
  else {
    for (elen = 0; elen < (int)buffer1._1020_4_; elen = elen + 1) {
      iVar1 = stb_dir_is_prefix(src,local_430,filelist[elen]);
      if (iVar1 != 0) {
        pcVar3 = filelist[elen];
        if (files == (char **)0x0) {
          local_87c = 0;
        }
        else {
          local_87c = *(int *)(files + -2);
        }
        if (files == (char **)0x0) {
          local_884 = 0;
        }
        else {
          local_884 = *(int *)((long)files + -0xc);
        }
        if (local_884 < local_87c + 1) {
          stb__arr_addlen_(&files,8,1);
        }
        else {
          *(int *)(files + -2) = *(int *)(files + -2) + 1;
        }
        if (files == (char **)0x0) {
          local_894 = 0;
        }
        else {
          local_894 = *(int *)(files + -2);
        }
        files[(long)local_894 + -1] = pcVar3;
      }
    }
    if (files == (char **)0x0) {
      src_local = (char *)0x0;
    }
    else {
      d._4_4_ = local_430;
      if ((local_430 == 0) && ((**files == '/' || (**files == '\\')))) {
        d._4_4_ = 1;
      }
      else if (local_430 != 0) {
        d._4_4_ = local_430 + 1;
      }
      elen = 0;
      while( true ) {
        if (files == (char **)0x0) {
          local_89c = 0;
        }
        else {
          local_89c = *(int *)(files + -2);
        }
        if (local_89c <= elen) break;
        pcVar3 = stb_strchr2(files[elen] + d._4_4_,'/','\\');
        if (pcVar3 == (char *)0x0) {
          pcVar3 = files[elen];
          if (s == (char *)0x0) {
            local_8ac = 0;
          }
          else {
            local_8ac = *(int *)(s + -0x10);
          }
          if (s == (char *)0x0) {
            local_8b4 = 0;
          }
          else {
            local_8b4 = *(int *)(s + -0xc);
          }
          if (local_8b4 < local_8ac + 1) {
            stb__arr_addlen_(&s,8,1);
          }
          else {
            *(int *)(s + -0x10) = *(int *)(s + -0x10) + 1;
          }
          if (s == (char *)0x0) {
            local_8c4 = 0;
          }
          else {
            local_8c4 = *(int *)(s + -0x10);
          }
          *(char **)(s + (long)local_8c4 * 8 + -8) = pcVar3;
          if (files == (char **)0x0) {
            local_8d4 = 0;
          }
          else {
            local_8d4 = *(int *)(files + -2);
          }
          files[elen] = files[local_8d4 + -1];
          *(int *)(files + -2) = *(int *)(files + -2) + -1;
        }
        else {
          elen = elen + 1;
        }
      }
      descendents = (char **)malloc(0x28);
      descendents[4] = s;
      *descendents = (char *)0x0;
      pcVar3 = strdup(src);
      descendents[2] = pcVar3;
      pcVar3 = stb_strrchr2(descendents[2],'/','\\');
      __base = files;
      if (pcVar3 == (char *)0x0) {
        buffer2._1016_8_ = descendents[2];
      }
      else {
        buffer2._1016_8_ = pcVar3 + 1;
      }
      descendents[3] = (char *)buffer2._1016_8_;
      if (files == (char **)0x0) {
        local_8e4 = 0;
      }
      else {
        local_8e4 = *(int *)(files + -2);
      }
      __compar = stb_qsort_stricmp(0);
      qsort(__base,(long)local_8e4,8,(__compar_fn_t)__compar);
      dlen._0_1_ = 0;
      elen = 0;
      while( true ) {
        if (files == (char **)0x0) {
          local_8f8 = 0;
        }
        else {
          local_8f8 = *(int *)(files + -2);
        }
        if (local_8f8 <= elen) break;
        pcVar3 = stb_strchr2(files[elen] + d._4_4_,'/','\\');
        if (pcVar3 == (char *)0x0) {
          __assert_fail("t",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                        ,0x1820,
                        "stb_dirtree2 *stb_dirtree2_from_files_relative(char *, char **, int)");
        }
        stb_strncpy((char *)&s_1,files[elen],((int)pcVar3 - (int)files[elen]) + 1);
        iVar1 = strcasecmp((char *)&dlen,(char *)&s_1);
        if (iVar1 != 0) {
          if (files == (char **)0x0) {
            local_90c = 0;
          }
          else {
            local_90c = *(int *)(files + -2);
          }
          psVar4 = stb_dirtree2_from_files_relative((char *)&s_1,files,local_90c);
          if (psVar4 == (stb_dirtree2 *)0x0) {
            __assert_fail("t != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                          ,0x1824,
                          "stb_dirtree2 *stb_dirtree2_from_files_relative(char *, char **, int)");
          }
          strcpy((char *)&dlen,(char *)&s_1);
          if (*descendents == (char *)0x0) {
            local_91c = 0;
          }
          else {
            local_91c = *(int *)(*descendents + -0x10);
          }
          if (*descendents == (char *)0x0) {
            local_924 = 0;
          }
          else {
            local_924 = *(int *)(*descendents + -0xc);
          }
          if (local_924 < local_91c + 1) {
            stb__arr_addlen_(descendents,8,1);
          }
          else {
            *(int *)(*descendents + -0x10) = *(int *)(*descendents + -0x10) + 1;
          }
          if (*descendents == (char *)0x0) {
            local_934 = 0;
          }
          else {
            local_934 = *(int *)(*descendents + -0x10);
          }
          *(stb_dirtree2 **)(*descendents + (long)local_934 * 8 + -8) = psVar4;
        }
        elen = elen + 1;
      }
      if (*descendents == (char *)0x0) {
        local_938 = 0;
      }
      else {
        local_938 = *(undefined4 *)(*descendents + -0x10);
      }
      *(undefined4 *)(descendents + 1) = local_938;
      *(undefined4 *)((long)descendents + 0xc) = 0;
      src_local = (char *)descendents;
    }
  }
  return (stb_dirtree2 *)src_local;
}

Assistant:

stb_dirtree2 *stb_dirtree2_from_files_relative(char *src, char **filelist, int count)
{
   char buffer1[1024];
   int i;
   int dlen = strlen(src), elen;
   stb_dirtree2 *d;
   char ** descendents = NULL;
   char ** files = NULL;
   char *s;
   if (!count) return NULL;
   // first find all the ones that belong here... note this is will take O(NM) with N files and M subdirs
   for (i=0; i < count; ++i) {
      if (stb_dir_is_prefix(src, dlen, filelist[i])) {
         stb_arr_push(descendents, filelist[i]);
      }
   }
   if (descendents == NULL)
      return NULL;
   elen = dlen;
   // skip a leading slash
   if (elen == 0 && (descendents[0][0] == '/' || descendents[0][0] == '\\'))
      ++elen;
   else if (elen)
      ++elen;
   // now extract all the ones that have their root here
   for (i=0; i < stb_arr_len(descendents);) {
      if (!stb_strchr2(descendents[i]+elen, '/', '\\')) {
         stb_arr_push(files, descendents[i]);
         descendents[i] = descendents[stb_arr_len(descendents)-1];
         stb_arr_pop(descendents);
      } else
         ++i;
   }
   // now create a record
   d = (stb_dirtree2 *) malloc(sizeof(*d));
   d->files = files;
   d->subdirs = NULL;
   d->fullpath = strdup(src);
   s = stb_strrchr2(d->fullpath, '/', '\\');
   if (s)
      ++s;
   else
      s = d->fullpath;
   d->relpath = s;
   // now create the children
   qsort(descendents, stb_arr_len(descendents), sizeof(char *), stb_qsort_stricmp(0));
   buffer1[0] = 0;
   for (i=0; i < stb_arr_len(descendents); ++i) {
      char buffer2[1024];
      char *s = descendents[i] + elen, *t;
      t = stb_strchr2(s, '/', '\\');
      assert(t);
      stb_strncpy(buffer2, descendents[i], t-descendents[i]+1);
      if (stb_stricmp(buffer1, buffer2)) {
         stb_dirtree2 *t = stb_dirtree2_from_files_relative(buffer2, descendents, stb_arr_len(descendents));
         assert(t != NULL);
         strcpy(buffer1, buffer2);
         stb_arr_push(d->subdirs, t);
      }
   }
   d->num_subdir = stb_arr_len(d->subdirs);
   d->weight = 0;
   return d;
}